

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void failingTestMethodWithCHECK_EQUAL_TEXT_(void)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_38 [2];
  SimpleString local_18;
  
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_18);
  pcVar2 = SimpleString::asCharString(&local_18);
  StringFrom((int)local_38);
  pcVar3 = SimpleString::asCharString(local_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,"Failed because it failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x1f9,pTVar4);
  SimpleString::~SimpleString(local_38);
  SimpleString::~SimpleString(&local_18);
  TestTestingFixture::lineExecutedAfterCheck();
  return;
}

Assistant:

static void failingTestMethodWithCHECK_EQUAL_TEXT_()
{
    CHECK_EQUAL_TEXT(1, 2, "Failed because it failed");
    TestTestingFixture::lineExecutedAfterCheck(); // LCOV_EXCL_LINE
}